

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::yield_leadership(raft_server *this,bool immediate_yield,int successor_id)

{
  element_type *peVar1;
  size_type sVar2;
  int32 iVar3;
  int iVar4;
  iterator iVar5;
  uint64_t uVar6;
  uint uVar7;
  __node_base *p_Var8;
  int successor_id_local;
  undefined1 local_a0 [56];
  string candidate_endpoint;
  unique_lock<std::recursive_mutex> guard;
  
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    return;
  }
  if (this->id_ != (this->leader_).super___atomic_base<int>._M_i) {
    return;
  }
  successor_id_local = successor_id;
  iVar3 = get_num_voting_members(this);
  if (iVar3 < 2) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (iVar4 < 2) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&candidate_endpoint,"this node is the only node in the cluster, will do nothing");
    (*peVar1->_vptr_logger[8])
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"yield_leadership",0x4a1,&candidate_endpoint);
    std::__cxx11::string::~string((string *)&candidate_endpoint);
    return;
  }
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  if (immediate_yield) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 3 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&candidate_endpoint,"got immediate re-elect request, resign now");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4a8,&candidate_endpoint);
      std::__cxx11::string::~string((string *)&candidate_endpoint);
    }
    LOCK();
    (this->leader_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    become_follower(this);
    LOCK();
    (this->hb_alive_)._M_base._M_i = false;
    UNLOCK();
    goto LAB_001afcc6;
  }
  candidate_endpoint._M_dataplus._M_p = (pointer)&candidate_endpoint.field_2;
  candidate_endpoint._M_string_length = 0;
  candidate_endpoint.field_2._M_local_buf[0] = '\0';
  nuraft::context::get_params((context *)local_a0);
  iVar4 = *(int *)&((element_type *)(local_a0._0_8_ + 8))->_vptr_state_mgr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  if ((successor_id_local < 0) ||
     (iVar5 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->peers_)._M_h,&successor_id_local),
     iVar5.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
     _M_cur == (__node_type *)0x0)) {
    local_a0._32_8_ = (element_type *)0x0;
    local_a0._48_8_ = (element_type *)0x0;
LAB_001afa3b:
    p_Var8 = &(this->peers_)._M_h._M_before_begin;
    local_a0._44_4_ = 0xffffffff;
    while (p_Var8 = p_Var8->_M_nxt, uVar7 = local_a0._44_4_, p_Var8 != (__node_base *)0x0) {
      sVar2 = *(size_type *)(p_Var8 + 1);
      uVar6 = timer_helper::get_us
                        ((timer_helper *)
                         (*(_Hash_node_base **)
                           &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor + 0x28));
      if (((uint)sVar2 != this->id_) &&
         ((element_type *)(uVar6 / 1000) <= (element_type *)(long)iVar4)) {
        uVar7 = *(uint *)((long)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor)->
                                 _M_nxt[9]._M_nxt + 4);
        if ((int)local_a0._32_4_ < (int)uVar7) {
          std::__cxx11::string::_M_assign((string *)&candidate_endpoint);
          local_a0._32_8_ = ZEXT48(uVar7);
          local_a0._44_4_ = (uint)sVar2;
          local_a0._48_8_ = (element_type *)(uVar6 / 1000);
        }
      }
    }
  }
  else {
    uVar7 = *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            ._M_cur + 8);
    local_a0._32_8_ =
         ZEXT48(*(uint *)(**(long **)((long)iVar5.
                                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                            ._M_cur + 0x10) + 0x4c));
    std::__cxx11::string::_M_assign((string *)&candidate_endpoint);
    uVar6 = timer_helper::get_us
                      ((timer_helper *)
                       (*(long *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                        ._M_cur + 0x10) + 0x140));
    local_a0._48_8_ = uVar6 / 1000;
    if (uVar7 == 0xffffffff) goto LAB_001afa3b;
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (successor_id_local < 0) {
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 3 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a0,"got graceful re-elect request, pause write from now");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4e1,local_a0);
      goto LAB_001afbf0;
    }
  }
  else {
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 3 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a0,
                 "got graceful re-elect request (designated successor %d), pause write from now");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4d9,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    if ((((-1 < successor_id_local) && (successor_id_local != uVar7)) &&
        (peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar1 != (element_type *)0x0)) && (iVar4 = (*peVar1->_vptr_logger[7])(), 2 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a0,"could not find given successor %d",
                 (ulong)(uint)successor_id_local);
      (*peVar1->_vptr_logger[8])
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4dd,local_a0);
LAB_001afbf0:
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)uVar7 < 0) {
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 2 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a0,
                 "cannot find valid candidate for next leader, will proceed anyway");
      (*peVar1->_vptr_logger[8])
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4eb,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  else {
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 3 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_a0,
                 "next leader candidate: id %d endpoint %s priority %d last response %lu ms ago",
                 (ulong)uVar7,candidate_endpoint._M_dataplus._M_p,local_a0._32_8_,local_a0._48_8_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4e8,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    LOCK();
    (this->next_leader_candidate_).super___atomic_base<int>._M_i = uVar7;
    UNLOCK();
  }
  LOCK();
  (this->write_paused_)._M_base._M_i = true;
  UNLOCK();
  nuraft::context::get_params((context *)local_a0);
  timer_helper::set_duration_ms(&this->reelection_timer_,(long)*(int *)local_a0._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  timer_helper::reset(&this->reelection_timer_);
  std::__cxx11::string::~string((string *)&candidate_endpoint);
LAB_001afcc6:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::yield_leadership(bool immediate_yield,
                                   int successor_id)
{
    // Leader reelection is already happening.
    if (write_paused_) return;

    // Not a leader, do nothing.
    if (id_ != leader_) return;

    // This node is the only node, do nothing.
    if (get_num_voting_members() <= 1) {
        p_er("this node is the only node in the cluster, will do nothing");
        return;
    }

    recur_lock(lock_);

    if (immediate_yield) {
        p_in("got immediate re-elect request, resign now");
        leader_ = -1;
        become_follower();
        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    // Not immediate yield, nominate the successor.
    int max_priority = 0;
    int candidate_id = -1;
    uint64_t last_resp_ms = 0;
    std::string candidate_endpoint;
    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;
    if (successor_id >= 0) {
        // If successor is given, find that one.
        auto entry = peers_.find(successor_id);
        if (entry != peers_.end()) {
            int32 srv_id = entry->first;
            ptr<peer>& pp = entry->second;
            max_priority = pp->get_config().get_priority();
            candidate_id = srv_id;
            candidate_endpoint = pp->get_config().get_endpoint();
            last_resp_ms = pp->get_resp_timer_us() / 1000;
        }
    }

    // Successor is not given or the given successor is incorrect,
    // find the highest priority node whose response time is not expired.
    if (candidate_id == -1) {
        for (auto& entry: peers_) {
            int32 srv_id = entry.first;
            ptr<peer>& pp = entry.second;
            uint64_t pp_last_resp_ms = pp->get_resp_timer_us() / 1000;

            if ( srv_id != id_ &&
                 pp_last_resp_ms <= hb_interval_ms &&
                 pp->get_config().get_priority() > max_priority ) {
                max_priority = pp->get_config().get_priority();
                candidate_id = srv_id;
                candidate_endpoint = pp->get_config().get_endpoint();
                last_resp_ms = pp_last_resp_ms;
            }
        }
    }

    if (successor_id >= 0) {
        p_in("got graceful re-elect request (designated successor %d), "
             "pause write from now",
             successor_id);

        if ( successor_id >= 0 &&
             successor_id != candidate_id ) {
            p_wn("could not find given successor %d", successor_id);
        }

    } else {
        p_in("got graceful re-elect request, pause write from now");
    }

    if (candidate_id > -1) {
        p_in("next leader candidate: id %d endpoint %s priority %d "
             "last response %" PRIu64 " ms ago",
             candidate_id, candidate_endpoint.c_str(), max_priority,
             last_resp_ms);
        next_leader_candidate_ = candidate_id;;
    } else {
        p_wn("cannot find valid candidate for next leader, will proceed anyway");
    }

    // Reset reelection timer, and pause write.
    write_paused_ = true;

    // Wait until election timeout upper bound.
    reelection_timer_.set_duration_ms
                      ( ctx_->get_params()->election_timeout_upper_bound_ );
    reelection_timer_.reset();
}